

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

void __thiscall
ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator
          (ON_SubDMeshFragmentIterator *this,ON_SubDFaceIterator *fit)

{
  ON_SubDFace *pOVar1;
  ON_SubDFace *pOVar2;
  uint uVar3;
  uint uVar4;
  ON_SubD *other_subd;
  
  (this->m_limit_mesh).m_impl_sp.super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_limit_mesh).m_impl_sp.super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ON_SubD::ON_SubD(&this->m_subd);
  ON_SubDRef::ON_SubDRef(&(this->m_fit).m_subd_ref);
  (this->m_fit).m_face_current = (ON_SubDFace *)0x0;
  (this->m_fit).m_face_index = 0;
  (this->m_fit).m_face_count = 0;
  (this->m_fit).m_face_first = (ON_SubDFace *)0x0;
  (this->m_fit).m_face_last = (ON_SubDFace *)0x0;
  (this->m_fit).m_component_ptr.m_ptr = 0;
  this->m_current_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_bFromFaceFragments = false;
  this->m_bHaveCounts = false;
  this->m_subd_appearance_override = Unset;
  this->m_reserved_density_reduction = '\0';
  this->m_maximum_mesh_density = 0;
  this->m_full_size_fragment_count = 0;
  this->m_half_size_fragment_count = 0;
  other_subd = ON_SubDRef::SubD(&fit->m_subd_ref);
  ON_SubD::ShareDimple(&this->m_subd,other_subd);
  ON_SubDRef::operator=(&(this->m_fit).m_subd_ref,&fit->m_subd_ref);
  (this->m_fit).m_component_ptr.m_ptr = (fit->m_component_ptr).m_ptr;
  pOVar1 = fit->m_face_first;
  pOVar2 = fit->m_face_last;
  uVar3 = fit->m_face_index;
  uVar4 = fit->m_face_count;
  (this->m_fit).m_face_current = fit->m_face_current;
  (this->m_fit).m_face_index = uVar3;
  (this->m_fit).m_face_count = uVar4;
  (this->m_fit).m_face_first = pOVar1;
  (this->m_fit).m_face_last = pOVar2;
  this->m_bFromFaceFragments = true;
  return;
}

Assistant:

ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator(const ON_SubDFaceIterator& fit)
{
  m_subd.ShareDimple(fit.SubD());
  m_fit = fit;
  m_bFromFaceFragments = true;
}